

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_draw_lbd_circles.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  LBDOperator *pLVar3;
  vector<int,_std::allocator<int>_> local_118;
  _InputArray local_f8;
  allocator local_d9;
  string local_d8 [48];
  Size_<int> local_a8;
  Mat local_a0 [8];
  Mat destImage;
  Size_<int> local_40;
  LBDOperator *local_38;
  LBDOperator *LBD;
  int lbdType;
  Size psize;
  Size imsize;
  int M;
  char **argv_local;
  int argc_local;
  
  cv::Size_<int>::Size_(&psize,0x200,0x200);
  cv::Size_<int>::Size_((Size_<int> *)((long)&LBD + 4),0x20,0x20);
  iVar2 = strncmp(argv[1],"freak",5);
  if (iVar2 == 0) {
    LBD._0_4_ = 0;
  }
  else {
    iVar2 = strncmp(argv[1],"brief",5);
    if (iVar2 != 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Error. The parameter should be either freak or brief.\n");
      return -1;
    }
    LBD._0_4_ = 2;
  }
  pLVar3 = lts2::CreateLbdOperator((int)LBD,0x100);
  local_38 = pLVar3;
  cv::Size_<int>::Size_(&local_40,(Size_<int> *)((long)&LBD + 4));
  (*(pLVar3->super_LinearOperator)._vptr_LinearOperator[5])(pLVar3,&local_40);
  cv::Size_<int>::Size_(&local_a8,&psize);
  cv::Mat::Mat(local_a0,&local_a8,0x10);
  lts2::LBDOperator::drawSelfAsCircles(local_38,local_a0);
  pcVar1 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
  cv::_InputArray::_InputArray(&local_f8,local_a0);
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_118);
  cv::imwrite(local_d8,&local_f8,(vector *)&local_118);
  std::vector<int,_std::allocator<int>_>::~vector(&local_118);
  cv::_InputArray::~_InputArray(&local_f8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  cv::Mat::~Mat(local_a0);
  return 0;
}

Assistant:

int main(int argc, char * const *argv)
{
  int M = 256;
  cv::Size imsize(512, 512);
  cv::Size psize(32,32);

  int lbdType;
  if (strncmp(argv[1], "freak", 5) == 0)
  {
    lbdType = (int)lbd::LBD_TYPE::eTypeFreak;;
  }
  else
  {
    if (strncmp(argv[1], "brief", 5) == 0)
    {
      lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
    }
    else
    {
      std::cerr << "Error. The parameter should be either freak or brief.\n";
      return -1;
    }
  }

  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType, M);
  LBD->initWithPatchSize(psize);

  cv::Mat destImage(cv::Size(imsize), CV_8UC3);
  LBD->drawSelfAsCircles(destImage);
  
  cv::imwrite(argv[2], destImage);

  return EXIT_SUCCESS;
}